

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O1

int xmlNodeSetSpacePreserve(xmlNodePtr cur,int val)

{
  int iVar1;
  xmlAttrPtr pxVar2;
  char *value;
  xmlNsPtr ns;
  xmlNsPtr local_18;
  
  iVar1 = 1;
  if (cur != (xmlNodePtr)0x0) {
    local_18 = (xmlNsPtr)&DAT_00000001;
    if ((cur->type == XML_ELEMENT_NODE) &&
       (iVar1 = xmlSearchNsByHrefSafe
                          (cur,(xmlChar *)"http://www.w3.org/XML/1998/namespace",&local_18),
       iVar1 == 0)) {
      value = "preserve";
      if (val == 0) {
        value = "default";
      }
      pxVar2 = xmlSetNsProp(cur,local_18,"space",(xmlChar *)value);
      iVar1 = -(uint)(pxVar2 == (xmlAttrPtr)0x0);
    }
  }
  return iVar1;
}

Assistant:

int
xmlNodeSetSpacePreserve(xmlNodePtr cur, int val) {
    xmlNsPtr ns;
    xmlAttrPtr attr;
    const char *string;
    int res;

    if ((cur == NULL) || (cur->type != XML_ELEMENT_NODE))
        return(1);

    res = xmlSearchNsByHrefSafe(cur, XML_XML_NAMESPACE, &ns);
    if (res != 0)
	return(res);

    if (val == 0)
        string = "default";
    else
        string = "preserve";

    attr = xmlSetNsProp(cur, ns, BAD_CAST "space", BAD_CAST string);
    if (attr == NULL)
        return(-1);

    return(0);
}